

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_array(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int __fd;
  undefined1 *puVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  void *__s1;
  void *__s2;
  ulong uVar11;
  undefined1 *unaff_R12;
  undefined1 *unaff_R13;
  undefined1 *puVar12;
  void *unaff_R14;
  ulong unaff_R15;
  bson_t compare;
  bson_t b;
  bson_error_t error;
  undefined1 auStack_1080 [4];
  uint uStack_107c;
  undefined1 auStack_1000 [4];
  uint uStack_ffc;
  undefined1 auStack_f80 [200];
  undefined1 auStack_eb8 [648];
  undefined1 *puStack_c30;
  undefined1 *puStack_c28;
  undefined1 *puStack_c20;
  void *pvStack_c18;
  ulong uStack_c10;
  code *pcStack_c08;
  undefined1 auStack_c00 [4];
  uint uStack_bfc;
  undefined1 auStack_b80 [4];
  uint uStack_b7c;
  undefined1 auStack_ab8 [648];
  undefined1 *puStack_830;
  undefined1 *puStack_828;
  undefined1 *puStack_820;
  void *pvStack_818;
  ulong uStack_810;
  code *pcStack_808;
  undefined1 auStack_800 [4];
  uint uStack_7fc;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_6b8 [648];
  undefined1 *puStack_430;
  undefined1 *puStack_428;
  undefined1 *puStack_420;
  void *pvStack_418;
  ulong uStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [4];
  uint local_3fc;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  puVar5 = auStack_400;
  puVar12 = auStack_400;
  pcStack_408 = (code *)0x12fb66;
  bson_init(auStack_400);
  pcStack_408 = (code *)0x12fb7c;
  bson_append_int32(auStack_400,"0",1,0);
  pcStack_408 = (code *)0x12fb95;
  bson_append_int32(auStack_400,"1",1,1);
  pcStack_408 = (code *)0x12fbae;
  bson_append_int32(auStack_400,"2",1,2);
  pcStack_408 = (code *)0x12fbc7;
  bson_append_int32(auStack_400,"3",1,3);
  pcStack_408 = (code *)0x12fbea;
  cVar1 = bson_init_from_json(local_380,"[ 0, 1, 2, 3 ]",0xffffffffffffffff,local_2b8);
  if (cVar1 != '\0') {
    pcStack_408 = (code *)0x12fc02;
    unaff_R14 = (void *)bson_get_data(local_380);
    pcStack_408 = (code *)0x12fc10;
    puVar5 = (undefined1 *)bson_get_data(auStack_400);
    if (local_3fc == local_37c) {
      pcStack_408 = (code *)0x12fc29;
      pvVar6 = (void *)bson_get_data(auStack_400);
      pcStack_408 = (code *)0x12fc39;
      pvVar7 = (void *)bson_get_data(local_380);
      pcStack_408 = (code *)0x12fc48;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)local_3fc);
      if (iVar2 == 0) {
        pcStack_408 = (code *)0x12fc54;
        bson_destroy(auStack_400);
        pcStack_408 = (code *)0x12fc61;
        bson_destroy(local_380);
        return;
      }
    }
    unaff_R12 = local_380;
    pcStack_408 = (code *)0x12fc82;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_408 = (code *)0x12fc92;
    uVar9 = bson_as_canonical_extended_json(auStack_400,0);
    uVar3 = local_3fc;
    if (local_37c < local_3fc) {
      uVar3 = local_37c;
    }
    if (uVar3 != 0) {
      uVar3 = local_3fc;
      if (local_37c <= local_3fc) {
        uVar3 = local_37c;
      }
      uVar11 = 0;
      do {
        if (*(char *)((long)unaff_R14 + uVar11) != puVar5[uVar11]) {
          uVar11 = uVar11 & 0xffffffff;
          goto LAB_0012fccd;
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != (uint)uVar11);
    }
    uVar3 = local_37c;
    if (local_37c < local_3fc) {
      uVar3 = local_3fc;
    }
    uVar11 = (ulong)(uVar3 - 1);
LAB_0012fccd:
    pcStack_408 = (code *)0x12fceb;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar8,uVar9);
    pcStack_408 = (code *)0x12fd03;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_408 = (code *)0x12fd1e;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012fd6a:
      pcStack_408 = (code *)0x12fd6f;
      test_bson_json_array_cold_6();
LAB_0012fd6f:
      pcStack_408 = (code *)0x12fd74;
      test_bson_json_array_cold_5();
LAB_0012fd74:
      pcStack_408 = (code *)0x12fd79;
      test_bson_json_array_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar12 = auStack_400;
      if (uVar4 == 0xffffffff) goto LAB_0012fd6f;
      puVar12 = (undefined1 *)(ulong)local_37c;
      pcStack_408 = (code *)0x12fd42;
      puVar10 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar12);
      if (puVar10 != puVar12) goto LAB_0012fd74;
      unaff_R14 = (void *)(ulong)local_3fc;
      pcStack_408 = (code *)0x12fd5a;
      pvVar6 = (void *)write(uVar4,puVar5,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_408 = (code *)0x12fd6a;
        test_bson_json_array_cold_4();
        goto LAB_0012fd6a;
      }
    }
    pcStack_408 = (code *)0x12fd7e;
    test_bson_json_array_cold_3();
    unaff_R13 = puVar12;
  }
  pcStack_408 = test_bson_json_array_single;
  test_bson_json_array_cold_1();
  puVar10 = auStack_800;
  puVar12 = auStack_800;
  pcStack_808 = (code *)0x12fdae;
  puStack_430 = puVar5;
  puStack_428 = unaff_R12;
  puStack_420 = unaff_R13;
  pvStack_418 = unaff_R14;
  uStack_410 = unaff_R15;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_800);
  pcStack_808 = (code *)0x12fdc4;
  bson_append_int32(auStack_800,"0",1,0);
  pcStack_808 = (code *)0x12fde7;
  cVar1 = bson_init_from_json(auStack_780,"[ 0 ]",0xffffffffffffffff,auStack_6b8);
  if (cVar1 != '\0') {
    pcStack_808 = (code *)0x12fdff;
    unaff_R14 = (void *)bson_get_data(auStack_780);
    pcStack_808 = (code *)0x12fe0d;
    puVar10 = (undefined1 *)bson_get_data(auStack_800);
    if (uStack_7fc == uStack_77c) {
      pcStack_808 = (code *)0x12fe26;
      pvVar6 = (void *)bson_get_data(auStack_800);
      pcStack_808 = (code *)0x12fe36;
      pvVar7 = (void *)bson_get_data(auStack_780);
      pcStack_808 = (code *)0x12fe45;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_7fc);
      if (iVar2 == 0) {
        pcStack_808 = (code *)0x12fe51;
        bson_destroy(auStack_800);
        pcStack_808 = (code *)0x12fe5e;
        bson_destroy(auStack_780);
        return;
      }
    }
    unaff_R12 = auStack_780;
    pcStack_808 = (code *)0x12fe7f;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_808 = (code *)0x12fe8f;
    uVar9 = bson_as_canonical_extended_json(auStack_800,0);
    uVar3 = uStack_7fc;
    if (uStack_77c < uStack_7fc) {
      uVar3 = uStack_77c;
    }
    if (uVar3 != 0) {
      uVar3 = uStack_7fc;
      if (uStack_77c <= uStack_7fc) {
        uVar3 = uStack_77c;
      }
      uVar11 = 0;
      do {
        if (*(char *)((long)unaff_R14 + uVar11) != puVar10[uVar11]) {
          uVar11 = uVar11 & 0xffffffff;
          goto LAB_0012feca;
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != (uint)uVar11);
    }
    uVar3 = uStack_77c;
    if (uStack_77c < uStack_7fc) {
      uVar3 = uStack_7fc;
    }
    uVar11 = (ulong)(uVar3 - 1);
LAB_0012feca:
    pcStack_808 = (code *)0x12fee8;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar8,uVar9);
    pcStack_808 = (code *)0x12ff00;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_808 = (code *)0x12ff1b;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012ff67:
      pcStack_808 = (code *)0x12ff6c;
      test_bson_json_array_single_cold_6();
LAB_0012ff6c:
      pcStack_808 = (code *)0x12ff71;
      test_bson_json_array_single_cold_5();
LAB_0012ff71:
      pcStack_808 = (code *)0x12ff76;
      test_bson_json_array_single_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar12 = auStack_800;
      if (uVar4 == 0xffffffff) goto LAB_0012ff6c;
      puVar12 = (undefined1 *)(ulong)uStack_77c;
      pcStack_808 = (code *)0x12ff3f;
      puVar5 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar12);
      if (puVar5 != puVar12) goto LAB_0012ff71;
      unaff_R14 = (void *)(ulong)uStack_7fc;
      pcStack_808 = (code *)0x12ff57;
      pvVar6 = (void *)write(uVar4,puVar10,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_808 = (code *)0x12ff67;
        test_bson_json_array_single_cold_4();
        goto LAB_0012ff67;
      }
    }
    pcStack_808 = (code *)0x12ff7b;
    test_bson_json_array_single_cold_3();
    unaff_R13 = puVar12;
  }
  pcStack_808 = test_bson_json_array_int64;
  test_bson_json_array_single_cold_1();
  puVar5 = auStack_c00;
  puVar12 = auStack_c00;
  pcStack_c08 = (code *)0x12ffab;
  puStack_830 = puVar10;
  puStack_828 = unaff_R12;
  puStack_820 = unaff_R13;
  pvStack_818 = unaff_R14;
  uStack_810 = unaff_R15;
  pcStack_808 = (code *)&pcStack_408;
  bson_init(auStack_c00);
  pcStack_c08 = (code *)0x12ffc4;
  bson_append_int64(auStack_c00,"0",1,0x7b);
  pcStack_c08 = (code *)0x12ffdd;
  bson_append_int64(auStack_c00,"1",1,0x2a);
  pcStack_c08 = (code *)0x130000;
  cVar1 = bson_init_from_json(auStack_b80,
                              "[ { \"$numberLong\" : \"123\" },  { \"$numberLong\" : \"42\" } ]",
                              0xffffffffffffffff,auStack_ab8);
  puStack_c20 = unaff_R13;
  if (cVar1 != '\0') {
    pcStack_c08 = (code *)0x130018;
    unaff_R14 = (void *)bson_get_data(auStack_b80);
    pcStack_c08 = (code *)0x130026;
    puVar5 = (undefined1 *)bson_get_data(auStack_c00);
    if (uStack_bfc == uStack_b7c) {
      pcStack_c08 = (code *)0x13003f;
      pvVar6 = (void *)bson_get_data(auStack_c00);
      pcStack_c08 = (code *)0x13004f;
      pvVar7 = (void *)bson_get_data(auStack_b80);
      pcStack_c08 = (code *)0x13005e;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_bfc);
      if (iVar2 == 0) {
        pcStack_c08 = (code *)0x13006a;
        bson_destroy(auStack_c00);
        pcStack_c08 = (code *)0x130077;
        bson_destroy(auStack_b80);
        return;
      }
    }
    unaff_R12 = auStack_b80;
    pcStack_c08 = (code *)0x130098;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_c08 = (code *)0x1300a8;
    uVar9 = bson_as_canonical_extended_json(auStack_c00,0);
    uVar3 = uStack_bfc;
    if (uStack_b7c < uStack_bfc) {
      uVar3 = uStack_b7c;
    }
    if (uVar3 != 0) {
      uVar3 = uStack_bfc;
      if (uStack_b7c <= uStack_bfc) {
        uVar3 = uStack_b7c;
      }
      uVar11 = 0;
      do {
        if (*(char *)((long)unaff_R14 + uVar11) != puVar5[uVar11]) {
          uVar11 = uVar11 & 0xffffffff;
          goto LAB_001300e3;
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != (uint)uVar11);
    }
    uVar3 = uStack_b7c;
    if (uStack_b7c < uStack_bfc) {
      uVar3 = uStack_bfc;
    }
    uVar11 = (ulong)(uVar3 - 1);
LAB_001300e3:
    pcStack_c08 = (code *)0x130101;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar8,uVar9);
    pcStack_c08 = (code *)0x130119;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_c08 = (code *)0x130134;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_00130180:
      pcStack_c08 = (code *)0x130185;
      test_bson_json_array_int64_cold_6();
LAB_00130185:
      pcStack_c08 = (code *)0x13018a;
      test_bson_json_array_int64_cold_5();
LAB_0013018a:
      pcStack_c08 = (code *)0x13018f;
      test_bson_json_array_int64_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar12 = auStack_c00;
      if (uVar4 == 0xffffffff) goto LAB_00130185;
      puVar12 = (undefined1 *)(ulong)uStack_b7c;
      pcStack_c08 = (code *)0x130158;
      puVar10 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar12);
      if (puVar10 != puVar12) goto LAB_0013018a;
      unaff_R14 = (void *)(ulong)uStack_bfc;
      pcStack_c08 = (code *)0x130170;
      pvVar6 = (void *)write(uVar4,puVar5,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_c08 = (code *)0x130180;
        test_bson_json_array_int64_cold_4();
        goto LAB_00130180;
      }
    }
    pcStack_c08 = (code *)0x130194;
    test_bson_json_array_int64_cold_3();
    puStack_c20 = puVar12;
  }
  pcStack_c08 = test_bson_json_array_subdoc;
  test_bson_json_array_int64_cold_1();
  puStack_c30 = puVar5;
  puStack_c28 = unaff_R12;
  pvStack_c18 = unaff_R14;
  uStack_c10 = unaff_R15;
  pcStack_c08 = (code *)&pcStack_808;
  bson_init(auStack_1080);
  bson_init(auStack_f80);
  bson_append_int32(auStack_f80,"a",1,0x7b);
  bson_append_document(auStack_1080,"0",1,auStack_f80);
  cVar1 = bson_init_from_json(auStack_1000,"[ { \"a\" : 123 } ]",0xffffffffffffffff,auStack_eb8);
  if (cVar1 == '\0') goto LAB_001303bb;
  pvVar6 = (void *)bson_get_data(auStack_1000);
  pvVar7 = (void *)bson_get_data(auStack_1080);
  if (uStack_107c == uStack_ffc) {
    __s1 = (void *)bson_get_data(auStack_1080);
    __s2 = (void *)bson_get_data(auStack_1000);
    iVar2 = bcmp(__s1,__s2,(ulong)uStack_107c);
    if (iVar2 == 0) {
      bson_destroy(auStack_1080);
      bson_destroy(auStack_1000);
      return;
    }
  }
  uVar8 = bson_as_canonical_extended_json(auStack_1000,0);
  uVar9 = bson_as_canonical_extended_json(auStack_1080,0);
  uVar3 = uStack_107c;
  if (uStack_ffc < uStack_107c) {
    uVar3 = uStack_ffc;
  }
  if (uVar3 != 0) {
    uVar3 = uStack_107c;
    if (uStack_ffc <= uStack_107c) {
      uVar3 = uStack_ffc;
    }
    uVar11 = 0;
    do {
      if (*(char *)((long)pvVar6 + uVar11) != *(char *)((long)pvVar7 + uVar11)) {
        uVar11 = uVar11 & 0xffffffff;
        goto LAB_0013030a;
      }
      uVar11 = uVar11 + 1;
    } while (uVar3 != (uint)uVar11);
  }
  uVar3 = uStack_ffc;
  if (uStack_ffc < uStack_107c) {
    uVar3 = uStack_107c;
  }
  uVar11 = (ulong)(uVar3 - 1);
LAB_0013030a:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar8,uVar9);
  iVar2 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar2 == -1) {
LAB_001303a7:
    test_bson_json_array_subdoc_cold_6();
LAB_001303ac:
    test_bson_json_array_subdoc_cold_5();
LAB_001303b1:
    test_bson_json_array_subdoc_cold_2();
  }
  else {
    if (__fd == -1) goto LAB_001303ac;
    uVar11 = write(iVar2,pvVar6,(ulong)uStack_ffc);
    if (uVar11 != uStack_ffc) goto LAB_001303b1;
    uVar11 = write(__fd,pvVar7,(ulong)uStack_107c);
    if (uVar11 == uStack_107c) {
      test_bson_json_array_subdoc_cold_4();
      goto LAB_001303a7;
    }
  }
  test_bson_json_array_subdoc_cold_3();
LAB_001303bb:
  test_bson_json_array_subdoc_cold_1();
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : \"2016-12-13T12:34:56.123Z\" } }",0x158f82db9fb);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:00.000Z\" } }",0);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1969-12-31T16:00:00.000-0800\" } }",0);
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+01:00\" } }","Could not parse");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:\" } }",
             "reached end of date while looking for seconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:+01:00\" } }","seconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:00.\" } }",
             "reached end of date while looking for milliseconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.+01:00\" } }",
             "milliseconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"foo-01-01T00:00:00.000Z\" } }","year must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-foo-01T00:00:00.000Z\" } }","month must be an integer"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-fooT00:00:00.000Z\" } }","day must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01Tfoo:00:00.000Z\" } }","hour must be an integer")
  ;
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:foo:00.000Z\" } }",
             "minute must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:foo.000Z\" } }",
             "seconds must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000X\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+1\" } }","could not parse timezone"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+xx00\" } }",
             "could not parse timezone");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+0060\" } }",
             "timezone minute must be at most 59");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-0060\" } }",
             "timezone minute must be at most 59");
  return;
}

Assistant:

static void
test_bson_json_array (void)
{
   bson_error_t error;
   const char *json = "[ 0, 1, 2, 3 ]";
   bson_t b, compare;
   bool r;

   bson_init (&compare);
   bson_append_int32 (&compare, "0", 1, 0);
   bson_append_int32 (&compare, "1", 1, 1);
   bson_append_int32 (&compare, "2", 1, 2);
   bson_append_int32 (&compare, "3", 1, 3);

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);

   bson_eq_bson (&b, &compare);
   bson_destroy (&compare);
   bson_destroy (&b);
}